

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemExtensionManager.cpp
# Opt level: O1

BuildSystemExtension * __thiscall
llbuild::buildsystem::BuildSystemExtensionManager::lookupByCommandPath
          (BuildSystemExtensionManager *this,StringRef path)

{
  StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
  *this_00;
  long *plVar1;
  ProcessAttributes attr;
  undefined1 auVar2 [24];
  void *pvVar3;
  int iVar4;
  StringRef *pSVar5;
  char *path_00;
  Handle handle;
  code *pcVar6;
  BuildSystemExtension *pBVar7;
  ulong uVar8;
  ArrayRef<llvm::StringRef> commandLine;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_bool>
  pVar9;
  ProcessReleaseFn releaseFn;
  ProcessCompletionFn completionFn;
  SmallString<256U> infoPath;
  CapturingProcessDelegate delegate;
  SmallString<1024U> extensionPath;
  undefined6 uStack_a46;
  undefined6 uStack_a3e;
  _Any_data local_a28;
  code *local_a18;
  code *local_a10;
  _Any_data local_a08;
  code *local_9f8;
  code *local_9f0;
  POSIXEnvironment local_9e8;
  SmallVectorImpl<char> local_970;
  char local_960 [256];
  undefined1 local_860 [16];
  undefined8 local_850;
  Twine local_848 [42];
  char local_448;
  undefined1 local_440 [16];
  __node_base_ptr local_430;
  size_type sStack_428;
  float local_420;
  size_t local_418;
  __node_base_ptr p_Stack_410;
  condition_variable local_408 [48];
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_3d8;
  __native_type local_3d0 [23];
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  this_00 = &this->extensions;
  iVar4 = llvm::StringMapImpl::FindKey(&this_00->super_StringMapImpl,path);
  if ((iVar4 != -1) && ((long)iVar4 != (ulong)(this->extensions).super_StringMapImpl.NumBuckets)) {
    pBVar7 = (BuildSystemExtension *)(this_00->super_StringMapImpl).TheTable[iVar4][1].StrLen;
    goto LAB_00156cf3;
  }
  pVar9 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
          ::try_emplace<>(this_00,path);
  plVar1 = *(long **)(*(long *)pVar9.first.
                               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
                               .Ptr.
                               super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
                     + 8);
  *(undefined8 *)
   (*(long *)pVar9.first.
             super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
             .Ptr.
             super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
   + 8) = 0;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  local_970.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_960;
  local_970.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_970.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_970,path.Data,path.Data + path.Length);
  llvm::SmallVectorImpl<char>::append<char_const*,void>(&local_970,"-for-llbuild","");
  llvm::Twine::Twine((Twine *)local_860,&local_970);
  pBVar7 = (BuildSystemExtension *)0x0;
  iVar4 = llvm::sys::fs::access((char *)local_860,0);
  if (iVar4 == 0) {
    local_860._8_8_ = local_848;
    local_860._0_8_ = &PTR__CapturingProcessDelegate_00212e60;
    local_850._0_1_ = NullKind;
    local_850._1_1_ = NullKind;
    local_850._2_6_ = 0x4000000;
    local_440._0_8_ = &p_Stack_410;
    local_440._8_8_ = 1;
    local_430 = (_Hash_node_base *)0x0;
    sStack_428 = 0;
    local_420 = 1.0;
    local_418 = 0;
    p_Stack_410 = (__node_base_ptr)0x0;
    std::condition_variable::condition_variable(local_408);
    pvVar3 = local_970.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    local_3d8.super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         (AlignedCharArray<1UL,_1UL>)(char  [1])0x0;
    local_3d0[0].__align = 0;
    local_3d0[0]._8_8_ = 0;
    local_3d0[0]._16_8_ = 0;
    local_3d0[0].__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_3d0[0].__data.__list.__next = (__pthread_internal_list *)0x0;
    uVar8 = local_970.super_SmallVectorTemplateBase<char,_true>.
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
    pSVar5 = (StringRef *)operator_new(0x40);
    pSVar5->Data = (char *)pvVar3;
    pSVar5->Length = uVar8;
    pSVar5[1].Data = "--llbuild-extension-version";
    pSVar5[1].Length = 0x1b;
    pSVar5[2].Data = "0";
    pSVar5[2].Length = 1;
    pSVar5[3].Data = "--extension-path";
    pSVar5[3].Length = 0x10;
    local_a28._M_unused._M_object = (void *)0x0;
    local_a28._8_8_ = 0;
    local_a10 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:82:34)>
                ::_M_invoke;
    local_a18 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:82:34)>
                ::_M_manager;
    local_a08._M_unused._M_object = (void *)0x0;
    local_a08._8_8_ = 0;
    local_9f0 = std::
                _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:83:40)>
                ::_M_invoke;
    local_9f8 = std::
                _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystemExtensionManager.cpp:83:40)>
                ::_M_manager;
    local_9e8.keys._M_h._M_buckets = &local_9e8.keys._M_h._M_single_bucket;
    local_9e8.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_9e8.keys._M_h._M_element_count = 0;
    local_9e8.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9e8.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9e8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9e8.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9e8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_9e8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9e8.keys._M_h._M_bucket_count = 1;
    local_9e8.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_9e8.keys._M_h._M_rehash_policy._4_4_ = 0;
    local_9e8.keys._M_h._M_rehash_policy._M_next_resize = 0;
    local_9e8.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_9e8.isFrozen = false;
    attr._26_6_ = uStack_a46;
    attr.inheritEnvironment = true;
    attr.controlEnabled = true;
    auVar2 = ZEXT824(CONCAT62(uStack_a3e,1));
    attr.canSafelyInterrupt = (bool)auVar2[0];
    attr.connectToConsole = (bool)auVar2[1];
    attr._2_6_ = auVar2._2_6_;
    attr.workingDir.Data = (char *)SUB168(auVar2._8_16_,0);
    attr.workingDir.Length = SUB168(auVar2._8_16_,8);
    commandLine.Length = 4;
    commandLine.Data = pSVar5;
    llbuild::basic::spawnProcess
              ((ProcessDelegate *)local_860,(ProcessContext *)0x0,(ProcessGroup *)local_440,
               (ProcessHandle)0x0,commandLine,&local_9e8,attr,(ProcessReleaseFn *)&local_a28,
               (ProcessCompletionFn *)&local_a08);
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_9e8.keys._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_9e8.envStorage);
    if (local_9e8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9e8.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_9e8.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_9e8.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_9f8 != (code *)0x0) {
      (*local_9f8)(&local_a08,&local_a08,__destroy_functor);
    }
    if (local_a18 != (code *)0x0) {
      (*local_a18)(&local_a28,&local_a28,__destroy_functor);
    }
    operator_delete(pSVar5,0x40);
    llbuild::basic::ProcessGroup::~ProcessGroup((ProcessGroup *)local_440);
    local_440._0_8_ = &local_430;
    local_440._8_8_ = 0x40000000000;
    if ((int)local_850 != 0) {
      llvm::SmallVectorImpl<char>::operator=
                ((SmallVectorImpl<char> *)local_440,(SmallVectorImpl<char> *)(local_860 + 8));
    }
    if (local_448 == '\x01') {
      llvm::Twine::Twine((Twine *)&local_a28,&local_970);
      pBVar7 = (BuildSystemExtension *)0x0;
      iVar4 = llvm::sys::fs::access(local_a28._M_pod_data,0);
      if (iVar4 == 0) {
        path_00 = llvm::SmallString<1024U>::c_str((SmallString<1024U> *)local_440);
        handle = llbuild::basic::sys::OpenLibrary(path_00);
        if (handle != (Handle)0x0) {
          pcVar6 = (code *)llbuild::basic::sys::GetSymbolByname
                                     (handle,"initialize_llbuild_buildsystem_extension_v0");
          if ((pcVar6 != (code *)0x0) &&
             (pBVar7 = (BuildSystemExtension *)(*pcVar6)(), pBVar7 != (BuildSystemExtension *)0x0))
          {
            pVar9 = llvm::
                    StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
                    ::try_emplace<>(this_00,path);
            plVar1 = *(long **)(*(long *)pVar9.first.
                                         super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
                                         .Ptr.
                                         super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
                               + 8);
            *(BuildSystemExtension **)
             (*(long *)pVar9.first.
                       super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
                       .Ptr.
                       super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
             + 8) = pBVar7;
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 8))();
            }
            goto LAB_00156ca8;
          }
          llbuild::basic::sys::CloseLibrary(handle);
        }
        pBVar7 = (BuildSystemExtension *)0x0;
      }
    }
    else {
      pBVar7 = (BuildSystemExtension *)0x0;
    }
LAB_00156ca8:
    if ((__node_base_ptr *)local_440._0_8_ != &local_430) {
      free((void *)local_440._0_8_);
    }
    local_860._0_8_ = &PTR__CapturingProcessDelegate_00212e60;
    if ((Twine *)local_860._8_8_ != local_848) {
      free((void *)local_860._8_8_);
    }
    llbuild::basic::ProcessDelegate::~ProcessDelegate((ProcessDelegate *)local_860);
  }
  if ((char *)local_970.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_960)
  {
    free(local_970.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
LAB_00156cf3:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return pBVar7;
}

Assistant:

BuildSystemExtension*
BuildSystemExtensionManager::lookupByCommandPath(StringRef path) {
  std::lock_guard<std::mutex> guard(extensionsLock);

  // Check the cache.
  auto it = extensions.find(path);
  if (it != extensions.end()) return it->second.get();

  // Register negative hit, unless we succeed.
  extensions[path] = nullptr;

  // If missing, look for an extension for this path.
  //
  // Currently, extensions are discovered by expecting that a command has an
  // adjacent "...-for-llbuild" binary which can be queried for info.
  SmallString<256> infoPath{ path };
  infoPath += "-for-llbuild";
  if (!llvm::sys::fs::exists(infoPath)) {
    return {};
  }

  // If the path exists, then query it to find the actual extension library.
  struct CapturingProcessDelegate: ProcessDelegate {
    SmallString<1024> output;
    bool success;
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {}

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {};

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      output += data;
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      success = (result.status == ProcessStatus::Succeeded &&
                 result.exitCode == 0);
    }
  };
  CapturingProcessDelegate delegate;
  {
    // FIXME: Add a utility for capturing a subprocess infocation.
    ProcessAttributes attr{/*canSafelyInterrupt=*/true};
    ProcessGroup pgrp;
    ProcessHandle handle{0};
    std::vector<StringRef> cmd{infoPath, "--llbuild-extension-version", "0",
        "--extension-path" };
    ProcessReleaseFn releaseFn = [](std::function<void()>&& pwait){ pwait(); };
    ProcessCompletionFn completionFn = [](ProcessResult){};
    spawnProcess(delegate, nullptr, pgrp, handle, cmd, POSIXEnvironment(), attr,
                 std::move(releaseFn), std::move(completionFn));
  }

  // The output is expected to be the exact path to the extension (no extra
  // whitespace, etc.).
  auto extensionPath = delegate.output;
  if (!delegate.success || !llvm::sys::fs::exists(infoPath)) {
    return {};
  }

  // Load the plugin.
  auto handle = sys::OpenLibrary(extensionPath.c_str());
  if (handle == nullptr)
    return {};

  BuildSystemExtension *(*registrationFn)(void) =
      reinterpret_cast<decltype(registrationFn)>(sys::GetSymbolByname(handle,
                                                                      "initialize_llbuild_buildsystem_extension_v0"));
  if (!registrationFn) {
    sys::CloseLibrary(handle);
    return {};
  }

  // For now, we expect the registration to simply allocate and return us a (C)
  // extension instance.
  //
  // FIXME: This needs to be reworked to go through a C API.
  auto *extension = registrationFn();
  if (!extension) {
    sys::CloseLibrary(handle);
    return {};
  }

  extensions[path] = std::unique_ptr<BuildSystemExtension>(extension);
  return extension;
}